

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void __thiscall MasterObjectHolder::clearApp(MasterObjectHolder *this,int index)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *puVar3;
  ulong uVar4;
  unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *puVar5;
  difference_type __offset;
  ulong uVar6;
  _Map_pointer ppuVar7;
  __uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_> __ptr;
  unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *puVar8;
  default_delete<helics::AppObject> *this_00;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  handle appList;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &(this->apps).m_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  ppuVar1 = (this->apps).m_obj.
            super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar7 = (this->apps).m_obj.
            super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  if ((index < 0) ||
     (puVar2 = (this->apps).m_obj.
               super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
     (int)((int)((ulong)((long)(this->apps).m_obj.
                               super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)puVar2) >> 3
                ) + (int)((ulong)((long)(this->apps).m_obj.
                                        super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                 (long)(this->apps).m_obj.
                                       super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
          ((((uint)((int)ppuVar1 - (int)ppuVar7) >> 3) - 1) + (uint)(ppuVar1 == (_Map_pointer)0x0))
          * 0x40) <= index)) goto LAB_00199414;
  uVar6 = ((long)puVar2 -
           (long)(this->apps).m_obj.
                 super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + (ulong)(uint)index;
  if ((long)uVar6 < 0) {
    uVar4 = (long)uVar6 >> 6;
LAB_0019926a:
    puVar8 = ppuVar7[uVar4];
    (puVar8[(uint)uVar6 & 0x3f]._M_t.
     super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
     super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
     super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl)->valid = 0;
    lVar11 = uVar6 + uVar4 * -0x40;
    __ptr._M_t.super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
    super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl =
         (tuple<helics::AppObject_*,_std::default_delete<helics::AppObject>_>)
         puVar8[lVar11]._M_t.
         super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
         super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
         super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl;
    puVar8[lVar11]._M_t.
    super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
    super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl = (AppObject *)0x0;
    if ((_Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>)
        __ptr._M_t.
        super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
        super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl != (AppObject *)0x0) {
      this_00 = (default_delete<helics::AppObject> *)(puVar8 + lVar11);
      goto LAB_0019929a;
    }
  }
  else {
    if (0x3f < uVar6) {
      uVar4 = uVar6 >> 6;
      goto LAB_0019926a;
    }
    this_00 = (default_delete<helics::AppObject> *)(puVar2 + (uint)index);
    __ptr._M_t.super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
    super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl =
         *(tuple<helics::AppObject_*,_std::default_delete<helics::AppObject>_> *)this_00;
    *(int *)((long)__ptr._M_t.
                   super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
                   .super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl + 0x34) = 0;
    *(__uniq_ptr_data<helics::AppObject,_std::default_delete<helics::AppObject>,_true,_true> *)
     this_00 = (__uniq_ptr_data<helics::AppObject,_std::default_delete<helics::AppObject>,_true,_true>
                )0x0;
LAB_0019929a:
    std::default_delete<helics::AppObject>::operator()
              (this_00,(AppObject *)
                       __ptr._M_t.
                       super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
                       .super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl);
  }
  ppuVar1 = (this->apps).m_obj.
            super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar7 = (this->apps).m_obj.
            super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar11 = (((ulong)((long)ppuVar1 - (long)ppuVar7) >> 3) - (ulong)(ppuVar1 != (_Map_pointer)0x0)) *
           0x40;
  puVar3 = (this->apps).m_obj.
           super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  lVar9 = (long)puVar3 -
          (long)(this->apps).m_obj.
                super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3;
  puVar5 = (this->apps).m_obj.
           super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar8 = (this->apps).m_obj.
           super__Deque_base<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  lVar12 = ((long)puVar8 - (long)puVar5 >> 3) + lVar9;
  if ((ulong)(lVar12 + lVar11) < 0xb) goto LAB_00199414;
  lVar10 = lVar12 + lVar11 >> 2;
  if (0 < lVar10) {
    lVar10 = lVar10 + 1;
    do {
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
          super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl != (AppObject *)0x0)
      goto LAB_0019940a;
      puVar5 = puVar5 + 1;
      if (puVar5 == puVar8) {
        puVar5 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        puVar8 = puVar5 + 0x40;
      }
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
          super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl != (AppObject *)0x0)
      goto LAB_0019940a;
      puVar5 = puVar5 + 1;
      if (puVar5 == puVar8) {
        puVar5 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        puVar8 = puVar5 + 0x40;
      }
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
          super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl != (AppObject *)0x0)
      goto LAB_0019940a;
      puVar5 = puVar5 + 1;
      if (puVar5 == puVar8) {
        puVar5 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        puVar8 = puVar5 + 0x40;
      }
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
          super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl != (AppObject *)0x0)
      goto LAB_0019940a;
      puVar5 = puVar5 + 1;
      if (puVar5 == puVar8) {
        puVar5 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        puVar8 = puVar5 + 0x40;
      }
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
    lVar11 = (((ulong)((long)ppuVar1 - (long)ppuVar7) >> 3) - (ulong)(ppuVar1 != (_Map_pointer)0x0))
             * 0x40;
    lVar12 = ((long)puVar8 - (long)puVar5 >> 3) + lVar9;
  }
  lVar12 = lVar12 + lVar11;
  if (lVar12 == 1) {
LAB_00199404:
    if ((puVar5->_M_t).
        super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
        super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl != (AppObject *)0x0)
    goto LAB_0019940a;
  }
  else {
    if (lVar12 == 2) {
LAB_001993f1:
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
          super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl == (AppObject *)0x0) {
        puVar5 = puVar5 + 1;
        if (puVar5 == puVar8) {
          puVar5 = ppuVar7[1];
        }
        goto LAB_00199404;
      }
    }
    else {
      if (lVar12 != 3) goto LAB_0019940f;
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
          super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl == (AppObject *)0x0) {
        puVar5 = puVar5 + 1;
        if (puVar5 == puVar8) {
          puVar5 = ppuVar7[1];
          ppuVar7 = ppuVar7 + 1;
          puVar8 = puVar5 + 0x40;
        }
        goto LAB_001993f1;
      }
    }
LAB_0019940a:
    if (puVar3 != puVar5) goto LAB_00199414;
  }
LAB_0019940f:
  std::
  deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
  ::clear(&(this->apps).m_obj);
LAB_00199414:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void MasterObjectHolder::clearApp(int index)
{
    auto appList = apps.lock();
    if ((index < static_cast<int>(appList->size())) && (index >= 0)) {
        (*appList)[index]->valid = 0;
        (*appList)[index] = nullptr;
        if (appList->size() > 10) {
            if (std::none_of(appList->begin(), appList->end(), [](const auto& app) { return static_cast<bool>(app); })) {
                appList->clear();
            }
        }
    }
}